

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O0

void __thiscall
QBlitterPaintEnginePrivate::updateCompleteState(QBlitterPaintEnginePrivate *this,QPainterState *s)

{
  QBlitterPaintEnginePrivate *in_RSI;
  QPainterState *in_RDI;
  QBlitterPaintEnginePrivate *unaff_retaddr;
  QPainterState *s_00;
  
  s_00 = in_RDI;
  updatePenState(in_RSI,in_RDI);
  updateBrushState(unaff_retaddr,s_00);
  updateOpacityState(in_RSI,in_RDI);
  updateCompositionModeState(unaff_retaddr,s_00);
  updateRenderHintsState(unaff_retaddr,s_00);
  updateTransformState(this,s);
  updateClipState(this,s);
  return;
}

Assistant:

void QBlitterPaintEnginePrivate::updateCompleteState(QPainterState *s)
{
    updatePenState(s);
    updateBrushState(s);
    updateOpacityState(s);
    updateCompositionModeState(s);
    updateRenderHintsState(s);
    updateTransformState(s);
    updateClipState(s);
}